

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::exceptions::invalid_option_syntax::~invalid_option_syntax(invalid_option_syntax *this)

{
  void *in_RDI;
  
  ~invalid_option_syntax((invalid_option_syntax *)0x12b918);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit invalid_option_syntax(const std::string& text)
  : parsing("Argument " + LQUOTE + text + RQUOTE +
            " starts with a - but has incorrect syntax")
  {
  }